

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O1

int nghttp2_stream_defer_item(nghttp2_stream *stream,uint8_t flags)

{
  int iVar1;
  byte bVar2;
  
  if (stream->item != (nghttp2_outbound_item *)0x0) {
    bVar2 = flags | stream->flags;
    stream->flags = bVar2;
    if ((bVar2 & 0x10) == 0) {
      iVar1 = nghttp2_pq_empty(&stream->obq);
      if (iVar1 != 0) {
        stream_obq_remove(stream);
      }
    }
    return 0;
  }
  __assert_fail("stream->item",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0x208,"int nghttp2_stream_defer_item(nghttp2_stream *, uint8_t)");
}

Assistant:

int nghttp2_stream_defer_item(nghttp2_stream *stream, uint8_t flags) {
  assert(stream->item);

  DEBUGF("stream: stream=%d defer item=%p cause=%02x\n", stream->stream_id,
         stream->item, flags);

  stream->flags |= flags;

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  return stream_update_dep_on_detach_item(stream);
}